

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::erase
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *this,key_type *key)

{
  iterator pos;
  bool bVar1;
  iterator local_80;
  Node *local_68;
  Node *local_60;
  InnerMap *local_58;
  iterator local_50;
  undefined1 local_38 [8];
  iterator it;
  key_type *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find((iterator *)local_38,this,key);
  end(&local_50,this);
  bVar1 = protobuf::operator==((iterator *)local_38,&local_50);
  if (!bVar1) {
    local_68 = (Node *)local_38;
    local_60 = it.it_.node_;
    local_58 = it.it_.m_;
    pos.it_.m_ = (InnerMap *)it.it_.node_;
    pos.it_.node_ = (Node *)local_38;
    pos.it_.bucket_index_ = (size_type)it.it_.m_;
    erase(&local_80,this,pos);
  }
  this_local = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)(ulong)!bVar1;
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_type& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }